

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalDelimGet::Deserialize(LogicalDelimGet *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  _func_int **pp_Var4;
  LogicalOperator *this_00;
  vector<duckdb::LogicalType,_true> chunk_types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_78;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_58;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_38;
  _func_int **pp_Var3;
  
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"table_index");
  pp_Var4 = deserializer->_vptr_Deserializer;
  if ((char)uVar1 == '\0') {
    pp_Var3 = (_func_int **)0x0;
  }
  else {
    iVar2 = (*pp_Var4[0x15])(deserializer);
    pp_Var3 = (_func_int **)CONCAT44(extraout_var,iVar2);
    pp_Var4 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var4[5])(deserializer,(ulong)(uVar1 & 0xff));
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&local_78,deserializer,0xc9,"chunk_types");
  this_00 = (LogicalOperator *)operator_new(0x88);
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalOperator::LogicalOperator(this_00,LOGICAL_DELIM_GET);
  this_00->_vptr_LogicalOperator = (_func_int **)&PTR__LogicalDelimGet_024ac220;
  this_00[1]._vptr_LogicalOperator = pp_Var3;
  *(undefined8 *)&this_00[1].type = 0;
  this_00[1].children.
  super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this_00[1].children.
  super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)this_00[1].children.
                super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)this_00[1].children.
                super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)&this_00[1].type =
       local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  this_00[1].children.
  super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_58.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  this_00[1].children.
  super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_58.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_38);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_58);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_78);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalDelimGet::Deserialize(Deserializer &deserializer) {
	auto table_index = deserializer.ReadPropertyWithDefault<idx_t>(200, "table_index");
	auto chunk_types = deserializer.ReadPropertyWithDefault<vector<LogicalType>>(201, "chunk_types");
	auto result = duckdb::unique_ptr<LogicalDelimGet>(new LogicalDelimGet(table_index, std::move(chunk_types)));
	return std::move(result);
}